

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

byte __thiscall nuraft::buffer::get_byte(buffer *this)

{
  uint uVar1;
  uint uVar2;
  buffer bVar3;
  uint uVar4;
  overflow_error *this_00;
  
  uVar1 = *(uint *)this;
  uVar4 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar4 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = *(uint *)(this + 4);
    if ((uVar4 & uVar1) == uVar2) goto LAB_00185f8c;
    bVar3 = this[(ulong)uVar2 + 8];
    *(uint *)(this + 4) = uVar2 + 1;
  }
  else {
    if ((uVar4 & uVar1) == uVar1 >> 0x10) {
LAB_00185f8c:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    bVar3 = this[(ulong)(uVar1 >> 0x10) + 4];
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 1;
  }
  return (byte)bVar3;
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}